

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O3

bool absl::lts_20250127::StrContainsIgnoreCase(string_view haystack,string_view needle)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  string_view piece1;
  
  uVar2 = needle._M_len;
  pcVar4 = haystack._M_str;
  uVar3 = haystack._M_len;
  if (uVar3 < uVar2) {
    return false;
  }
  do {
    uVar3 = uVar3 - 1;
    piece1._M_str = pcVar4;
    piece1._M_len = uVar2;
    bVar1 = EqualsIgnoreCase(piece1,needle);
    if (bVar1) {
      return bVar1;
    }
    pcVar4 = pcVar4 + 1;
  } while (uVar2 <= uVar3);
  return bVar1;
}

Assistant:

bool StrContainsIgnoreCase(absl::string_view haystack,
                           absl::string_view needle) noexcept {
  while (haystack.size() >= needle.size()) {
    if (StartsWithIgnoreCase(haystack, needle)) return true;
    haystack.remove_prefix(1);
  }
  return false;
}